

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall spdlog::details::scoped_padder::pad_it(scoped_padder *this,long count)

{
  memory_buf_t *pmVar1;
  char *__src;
  char *buf_ptr;
  ulong uVar2;
  ptrdiff_t _Num;
  
  pmVar1 = this->dest_;
  __src = (this->spaces_).data_;
  uVar2 = (pmVar1->super_buffer<char>).size_ + count;
  if ((pmVar1->super_buffer<char>).capacity_ < uVar2) {
    (**(pmVar1->super_buffer<char>)._vptr_buffer)(pmVar1,uVar2);
  }
  if (count != 0) {
    memmove((pmVar1->super_buffer<char>).ptr_ + (pmVar1->super_buffer<char>).size_,__src,count);
  }
  (pmVar1->super_buffer<char>).size_ = uVar2;
  return;
}

Assistant:

void pad_it(long count)
    {
        fmt_helper::append_string_view(string_view_t(spaces_.data(), static_cast<size_t>(count)), dest_);
    }